

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmClientContext.cpp
# Opt level: O0

GMM_CLIENT_CONTEXT * GmmCreateClientContextForAdapter(GMM_CLIENT ClientType,ADAPTER_BDF sBdf)

{
  Context *pLibContext_00;
  GMM_LIB_CONTEXT *this;
  size_t size;
  undefined8 local_50;
  GMM_LIB_CONTEXT *pLibContext;
  GMM_CLIENT_CONTEXT *pGmmClientContext;
  GMM_CLIENT ClientType_local;
  ADAPTER_BDF sBdf_local;
  
  pLibContext = (GMM_LIB_CONTEXT *)0x0;
  size = (size_t)(uint)sBdf.field_0;
  pLibContext_00 = GmmLib::GmmMultiAdapterContext::GetAdapterLibContext(pGmmMALibContext,sBdf);
  if (pLibContext_00 != (Context *)0x0) {
    this = (GMM_LIB_CONTEXT *)GmmMemAllocator::operator_new((GmmMemAllocator *)0x50,size);
    local_50 = (GMM_LIB_CONTEXT *)0x0;
    if (this != (GMM_LIB_CONTEXT *)0x0) {
      GmmLib::GmmClientContext::GmmClientContext((GmmClientContext *)this,ClientType,pLibContext_00)
      ;
      local_50 = this;
    }
    pLibContext = local_50;
  }
  return (GMM_CLIENT_CONTEXT *)pLibContext;
}

Assistant:

GMM_CLIENT_CONTEXT *GMM_STDCALL GmmCreateClientContextForAdapter(GMM_CLIENT  ClientType,
                                                                            ADAPTER_BDF sBdf)
{
    GMM_CLIENT_CONTEXT *pGmmClientContext = nullptr;
    GMM_LIB_CONTEXT *   pLibContext       = pGmmMALibContext->GetAdapterLibContext(sBdf);

    if (pLibContext)
    {
        pGmmClientContext = new GMM_CLIENT_CONTEXT(ClientType, pLibContext);

    }
    return pGmmClientContext;
}